

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  int iVar1;
  bool bVar2;
  __type _Var3;
  TokenType TVar4;
  string *psVar5;
  AlphaNum *in_R8;
  string_view message;
  string_view message_00;
  string_view message_01;
  string local_e0;
  string_view local_c0;
  string text;
  AlphaNum local_60;
  
  iVar1 = this->recursion_limit_;
  this->recursion_limit_ = iVar1 + -1;
  if (iVar1 < 1) {
    local_c0 = absl::lts_20250127::NullSafeStringView
                         (
                         "Message is too deep, the parser exceeded the configured recursion limit of "
                         );
    absl::lts_20250127::AlphaNum::AlphaNum(&local_60,this->initial_recursion_limit_);
    text._0_16_ = absl::lts_20250127::NullSafeStringView(".");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_c0,&local_60,(AlphaNum *)&text,in_R8);
    message._M_str = local_e0._M_dataplus._M_p;
    message._M_len = local_e0._M_string_length;
    ReportError(this,message);
    psVar5 = &local_e0;
LAB_002af2c5:
    std::__cxx11::string::~string((string *)psVar5);
LAB_002af2ca:
    bVar2 = false;
  }
  else {
    this_00 = &this->tokenizer_;
    if ((this->tokenizer_).current_.type == TYPE_STRING) {
      TVar4 = TYPE_STRING;
      while (TVar4 == TYPE_STRING) {
        io::Tokenizer::Next(this_00);
        TVar4 = (this_00->current_).type;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"[",(allocator<char> *)&local_60);
      bVar2 = TryConsume(this,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"]",(allocator<char> *)&local_60);
        bVar2 = TryConsume(this,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        if (!bVar2) {
          psVar5 = &(this->tokenizer_).current_.text;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"{",(allocator<char> *)&text);
            _Var3 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_c0);
            if (_Var3) {
              std::__cxx11::string::~string((string *)&local_c0);
LAB_002af3bf:
              bVar2 = SkipFieldMessage(this);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_60,"<",(allocator<char> *)&local_e0);
              _Var3 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_60);
              std::__cxx11::string::~string((string *)&local_60);
              std::__cxx11::string::~string((string *)&local_c0);
              if (_Var3) goto LAB_002af3bf;
              bVar2 = SkipFieldValue(this);
            }
            if (bVar2 == false) goto LAB_002af2ca;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"]",(allocator<char> *)&local_60);
            bVar2 = TryConsume(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            if (bVar2) break;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,",",(allocator<char> *)&local_60);
            bVar2 = Consume(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            if (!bVar2) {
              return false;
            }
          } while( true );
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"-",(allocator<char> *)&local_60);
        bVar2 = TryConsume(this,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        TVar4 = (this_00->current_).type;
        if (1 < TVar4 - TYPE_INTEGER) {
          if (TVar4 != TYPE_IDENTIFIER) {
            std::__cxx11::string::string
                      ((string *)&text,(string *)&(this->tokenizer_).current_.text);
            local_c0 = absl::lts_20250127::NullSafeStringView
                                 ("Cannot skip field value, unexpected token: ");
            local_60.piece_._M_len = text._M_string_length;
            local_60.piece_._M_str = text._M_dataplus._M_p;
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_e0,(lts_20250127 *)&local_c0,&local_60,
                       (AlphaNum *)text._M_string_length);
            message_01._M_str = local_e0._M_dataplus._M_p;
            message_01._M_len = local_e0._M_string_length;
            ReportError(this,message_01);
LAB_002af5b6:
            std::__cxx11::string::~string((string *)&local_e0);
            this->recursion_limit_ = this->recursion_limit_ + 1;
            psVar5 = &text;
            goto LAB_002af2c5;
          }
          if (bVar2) {
            std::__cxx11::string::string
                      ((string *)&text,(string *)&(this->tokenizer_).current_.text);
            absl::lts_20250127::AsciiStrToLower(&text);
            bVar2 = std::operator!=(&text,"inf");
            if (((bVar2) && (bVar2 = std::operator!=(&text,"infinity"), bVar2)) &&
               (bVar2 = std::operator!=(&text,"nan"), bVar2)) {
              local_c0 = absl::lts_20250127::NullSafeStringView("Invalid float number: ");
              local_60.piece_._M_len = text._M_string_length;
              local_60.piece_._M_str = text._M_dataplus._M_p;
              absl::lts_20250127::StrCat_abi_cxx11_
                        (&local_e0,(lts_20250127 *)&local_c0,&local_60,
                         (AlphaNum *)text._M_string_length);
              message_00._M_str = local_e0._M_dataplus._M_p;
              message_00._M_len = local_e0._M_string_length;
              ReportError(this,message_00);
              goto LAB_002af5b6;
            }
            std::__cxx11::string::~string((string *)&text);
          }
        }
        io::Tokenizer::Next(this_00);
      }
    }
    this->recursion_limit_ = this->recursion_limit_ + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      if (!TryConsume("]")) {
        while (true) {
          if (!LookingAt("{") && !LookingAt("<")) {
            DO(SkipFieldValue());
          } else {
            DO(SkipFieldMessage());
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError(
          absl::StrCat("Cannot skip field value, unexpected token: ", text));
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError(absl::StrCat("Invalid float number: ", text));
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }